

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::dogulitemsummary(summarycalc *this)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  int local_50;
  int local_4c;
  uint samplesize;
  int i;
  uint streamtype;
  allocator local_31;
  string local_30 [32];
  summarycalc *local_10;
  summarycalc *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"input/gulsummaryxref.bin",&local_31);
  loadsummaryxref(this,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  outputstreamtype(this);
  samplesize = 0;
  sVar2 = fread(&samplesize,4,1,_stdin);
  local_4c = (int)sVar2;
  if (local_4c == 0) {
    std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: Read error on stream\n");
  }
  else {
    bVar1 = isFMStream(this,samplesize);
    if (bVar1) {
      local_50 = 0;
      sVar2 = fread(&local_50,4,1,_stdin);
      local_4c = (int)sVar2;
      if (local_4c == 0) {
        std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: Read error on stream\n");
      }
      else {
        dosummaryprocessing(this,local_50);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: Not a fm stream\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: invalid stream type: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,samplesize);
    std::operator<<(poVar3,"\n");
  }
  exit(-1);
}

Assistant:

void summarycalc::dogulitemsummary()
{
	loadsummaryxref(GULSUMMARYXREF_FILE);
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (i) {
		if (isFMStream(streamtype) == true) {
			unsigned int samplesize = 0;
			i =(int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			if (i)	dosummaryprocessing(samplesize);
			else std::cerr << "FATAL: summarycalc: Read error on stream\n";
			return;
		}
		else {
			std::cerr << "FATAL: summarycalc: Not a fm stream\n";
			std::cerr << "FATAL: summarycalc: invalid stream type: " << streamtype << "\n";
		}
	}
	else {
		std::cerr << "FATAL: summarycalc: Read error on stream\n";
	}
	::exit(-1);

}